

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_> *
Scene::GetVertexAttributeDescriptions(void)

{
  pointer pVVar1;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  *in_RDI;
  allocator_type local_9;
  
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector(in_RDI,2,&local_9);
  pVVar1 = (in_RDI->
           super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar1->location = 0;
  pVVar1->binding = 0;
  pVVar1->format = VK_FORMAT_R32G32B32_SFLOAT;
  pVVar1->offset = 0;
  pVVar1[1].location = 1;
  pVVar1[1].binding = 0;
  pVVar1[1].format = VK_FORMAT_R32G32_SFLOAT;
  pVVar1[1].offset = 0xc;
  return in_RDI;
}

Assistant:

std::vector<VkVertexInputAttributeDescription> Scene::GetVertexAttributeDescriptions() {
	std::vector<VkVertexInputAttributeDescription> ret(2);
	ret[0].binding = 0;
	ret[0].location = 0;
	ret[0].format = VK_FORMAT_R32G32B32_SFLOAT;
	ret[0].offset = offsetof(Vertex, m_position);

	ret[1].binding = 0;
	ret[1].location = 1;
	ret[1].format = VK_FORMAT_R32G32_SFLOAT;
	ret[1].offset = offsetof(Vertex, m_texcoord);

	return ret;
}